

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

void __thiscall
cppqc::Generator<std::tuple<std::vector<int,std::allocator<int>>>>::
Generator<cppqc::detail::TupleGenerator<std::vector<int,std::allocator<int>>>>
          (Generator<std::tuple<std::vector<int,std::allocator<int>>>> *this,
          TupleGenerator<std::vector<int,_std::allocator<int>_>_> *gm)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  plVar2 = (long *)(**(code **)(*(long *)(gm->m_gen).
                                         super__Tuple_impl<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_>
                                         .
                                         super__Head_base<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>,_false>
                                         ._M_head_impl.m_gen._M_t.
                                         super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
                               + 0x20))();
  *puVar1 = &PTR__GenModel_0010fd50;
  uVar3 = (**(code **)(*plVar2 + 0x20))(plVar2);
  puVar1[1] = uVar3;
  *(undefined8 **)this = puVar1;
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

Generator(const Generator& g) : m_gen(g.m_gen->clone()) {}